

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O0

void __thiscall tensor_t<gradient_t>::tensor_t(tensor_t<gradient_t> *this,int _x,int _y,int _z)

{
  vector<gradient_t,_std::allocator<gradient_t>_> *__x;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffb8;
  vector<gradient_t,_std::allocator<gradient_t>_> *in_stack_ffffffffffffffc0;
  allocator_type local_31 [29];
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)0x1040db);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  __x = (vector<gradient_t,_std::allocator<gradient_t>_> *)(long)(local_c * local_10 * local_14);
  __a = local_31;
  std::allocator<gradient_t>::allocator((allocator<gradient_t> *)0x10411d);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__a);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::operator=
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)__a,__x);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::~vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)__a);
  std::allocator<gradient_t>::~allocator((allocator<gradient_t> *)0x104155);
  *(int *)(in_RDI + 0x18) = local_c;
  *(int *)(in_RDI + 0x1c) = local_10;
  *(int *)(in_RDI + 0x20) = local_14;
  return;
}

Assistant:

tensor_t(int _x, int _y, int _z) {
    data = std::vector<T>(static_cast<unsigned long>(_x * _y * _z));
    size.x = _x;
    size.y = _y;
    size.z = _z;
  }